

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

bool __thiscall cmDocumentation::PrintHelpOnePolicy(cmDocumentation *this,ostream *os)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  cmDocumentation *this_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string pname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_b8;
  string local_98 [8];
  pointer local_90;
  long local_88 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_58;
  pointer local_40;
  pointer local_38;
  pointer local_30;
  
  this_00 = (cmDocumentation *)&local_b8;
  pcVar1 = (this->CurrentArgument)._M_dataplus._M_p;
  local_98 = (string  [8])local_88;
  std::__cxx11::string::_M_construct<char*>
            (local_98,pcVar1,pcVar1 + (this->CurrentArgument)._M_string_length);
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.first._M_len = 7;
  local_58.first._M_str = "policy/";
  local_58.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40 = local_90;
  local_38 = (pointer)local_98;
  local_30 = (pointer)0x0;
  views._M_len = 2;
  views._M_array = &local_58;
  cmCatViews(&local_b8,views);
  bVar2 = PrintFiles(this_00,os,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Argument \"",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(this->CurrentArgument)._M_dataplus._M_p,
                        (this->CurrentArgument)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"\" to --help-policy is not a CMake policy.\n",0x2a);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  if (local_98 != (string  [8])local_88) {
    operator_delete((void *)local_98,local_88[0] + 1);
  }
  return bVar2;
}

Assistant:

bool cmDocumentation::PrintHelpOnePolicy(std::ostream& os)
{
  std::string pname = this->CurrentArgument;
  std::vector<std::string> files;
  if (this->PrintFiles(os, cmStrCat("policy/", pname))) {
    return true;
  }

  // Argument was not a policy.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-policy is not a CMake policy.\n";
  return false;
}